

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O2

ClassDecl * __thiscall SQASTReader::readClassDecl(SQASTReader *this)

{
  ClassDecl *table;
  Expr *pEVar1;
  Expr *pEVar2;
  
  table = newNode<SQCompilation::ClassDecl,Arena*,decltype(nullptr),decltype(nullptr)>
                    (this,this->astArena,(void *)0x0,(void *)0x0);
  readTableBody(this,&table->super_TableDecl);
  pEVar1 = readNullableExpression(this);
  pEVar2 = readNullableExpression(this);
  table->_key = pEVar1;
  table->_base = pEVar2;
  return table;
}

Assistant:

ClassDecl *SQASTReader::readClassDecl() {
  ClassDecl *klass = newNode<ClassDecl>(astArena, nullptr, nullptr);

  readTableBody(klass);

  Expr *key = readNullableExpression();
  Expr *base = readNullableExpression();

  klass->setClassKey(key);
  klass->setClassBase(base);

  return klass;
}